

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void fdct4x4_sse4_1(__m128i *in,__m128i *out,int bit,int num_col)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int32_t *piVar17;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int endidx;
  __m128i v3;
  __m128i v2;
  __m128i v1;
  __m128i v0;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  __m128i rnding;
  __m128i cospi16;
  __m128i cospi48;
  __m128i cospi32;
  int32_t *cospi;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  char local_36c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  
  piVar17 = cospi_arr(in_EDX);
  iVar1 = piVar17[0x20];
  iVar2 = piVar17[0x30];
  iVar3 = piVar17[0x10];
  local_36c = (char)in_EDX;
  iVar16 = 1 << (local_36c - 1U & 0x1f);
  uVar4 = in_RDI[(long)(in_ECX * 3) * 2];
  uVar5 = (in_RDI + (long)(in_ECX * 3) * 2)[1];
  local_268 = (int)*in_RDI;
  iStack_264 = (int)((ulong)*in_RDI >> 0x20);
  iStack_260 = (int)in_RDI[1];
  iStack_25c = (int)((ulong)in_RDI[1] >> 0x20);
  local_278 = (int)uVar4;
  iStack_274 = (int)((ulong)uVar4 >> 0x20);
  iStack_270 = (int)uVar5;
  iStack_26c = (int)((ulong)uVar5 >> 0x20);
  uVar4 = in_RDI[(long)(in_ECX * 3) * 2];
  uVar5 = (in_RDI + (long)(in_ECX * 3) * 2)[1];
  local_1e8 = (int)*in_RDI;
  iStack_1e4 = (int)((ulong)*in_RDI >> 0x20);
  iStack_1e0 = (int)in_RDI[1];
  iStack_1dc = (int)((ulong)in_RDI[1] >> 0x20);
  local_1f8 = (int)uVar4;
  iStack_1f4 = (int)((ulong)uVar4 >> 0x20);
  iStack_1f0 = (int)uVar5;
  iStack_1ec = (int)((ulong)uVar5 >> 0x20);
  uVar4 = in_RDI[(long)in_ECX * 2];
  uVar5 = (in_RDI + (long)in_ECX * 2)[1];
  uVar6 = in_RDI[(long)(in_ECX * 2) * 2];
  uVar7 = (in_RDI + (long)(in_ECX * 2) * 2)[1];
  local_288 = (int)uVar4;
  iStack_284 = (int)((ulong)uVar4 >> 0x20);
  iStack_280 = (int)uVar5;
  iStack_27c = (int)((ulong)uVar5 >> 0x20);
  local_298 = (int)uVar6;
  iStack_294 = (int)((ulong)uVar6 >> 0x20);
  iStack_290 = (int)uVar7;
  iStack_28c = (int)((ulong)uVar7 >> 0x20);
  uVar4 = in_RDI[(long)in_ECX * 2];
  uVar5 = (in_RDI + (long)in_ECX * 2)[1];
  uVar6 = in_RDI[(long)(in_ECX * 2) * 2];
  uVar7 = (in_RDI + (long)(in_ECX * 2) * 2)[1];
  local_208 = (int)uVar4;
  iStack_204 = (int)((ulong)uVar4 >> 0x20);
  iStack_200 = (int)uVar5;
  iStack_1fc = (int)((ulong)uVar5 >> 0x20);
  local_218 = (int)uVar6;
  iStack_214 = (int)((ulong)uVar6 >> 0x20);
  iStack_210 = (int)uVar7;
  iStack_20c = (int)((ulong)uVar7 >> 0x20);
  auVar15._4_4_ = iStack_264 + iStack_274;
  auVar15._0_4_ = local_268 + local_278;
  auVar15._12_4_ = iStack_25c + iStack_26c;
  auVar15._8_4_ = iStack_260 + iStack_270;
  auVar14._8_8_ = CONCAT44(iVar1,iVar1);
  auVar14._0_8_ = CONCAT44(iVar1,iVar1);
  auVar18 = pmulld(auVar15,auVar14);
  auVar13._4_4_ = iStack_284 + iStack_294;
  auVar13._0_4_ = local_288 + local_298;
  auVar13._12_4_ = iStack_27c + iStack_28c;
  auVar13._8_4_ = iStack_280 + iStack_290;
  auVar21._8_8_ = CONCAT44(iVar1,iVar1);
  auVar21._0_8_ = CONCAT44(iVar1,iVar1);
  auVar19 = pmulld(auVar13,auVar21);
  local_2a8 = auVar18._0_4_;
  iStack_2a4 = auVar18._4_4_;
  iStack_2a0 = auVar18._8_4_;
  iStack_29c = auVar18._12_4_;
  local_2b8 = auVar19._0_4_;
  iStack_2b4 = auVar19._4_4_;
  iStack_2b0 = auVar19._8_4_;
  iStack_2ac = auVar19._12_4_;
  auVar18 = ZEXT416(in_EDX);
  local_408 = CONCAT44(iStack_2a4 + iStack_2b4 + iVar16 >> auVar18,
                       local_2a8 + local_2b8 + iVar16 >> auVar18);
  uStack_400._0_4_ = iStack_2a0 + iStack_2b0 + iVar16 >> auVar18;
  uStack_400._4_4_ = iStack_29c + iStack_2ac + iVar16 >> auVar18;
  auVar21 = ZEXT416(in_EDX);
  auVar12._4_4_ = iStack_204 - iStack_214;
  auVar12._0_4_ = local_208 - local_218;
  auVar12._12_4_ = iStack_1fc - iStack_20c;
  auVar12._8_4_ = iStack_200 - iStack_210;
  auVar11._8_8_ = CONCAT44(iVar2,iVar2);
  auVar11._0_8_ = CONCAT44(iVar2,iVar2);
  auVar18 = pmulld(auVar12,auVar11);
  auVar10._4_4_ = iStack_1e4 - iStack_1f4;
  auVar10._0_4_ = local_1e8 - local_1f8;
  auVar10._12_4_ = iStack_1dc - iStack_1ec;
  auVar10._8_4_ = iStack_1e0 - iStack_1f0;
  auVar9._8_8_ = CONCAT44(iVar3,iVar3);
  auVar9._0_8_ = CONCAT44(iVar3,iVar3);
  auVar19 = pmulld(auVar10,auVar9);
  local_308 = auVar18._0_4_;
  iStack_304 = auVar18._4_4_;
  iStack_300 = auVar18._8_4_;
  iStack_2fc = auVar18._12_4_;
  local_318 = auVar19._0_4_;
  iStack_314 = auVar19._4_4_;
  iStack_310 = auVar19._8_4_;
  iStack_30c = auVar19._12_4_;
  auVar18 = ZEXT416(in_EDX);
  local_418 = CONCAT44(iStack_304 + iStack_314 + iVar16 >> auVar18,
                       local_308 + local_318 + iVar16 >> auVar18);
  uStack_410._0_4_ = iStack_300 + iStack_310 + iVar16 >> auVar18;
  uStack_410._4_4_ = iStack_2fc + iStack_30c + iVar16 >> auVar18;
  auVar8._4_4_ = iStack_204 - iStack_214;
  auVar8._0_4_ = local_208 - local_218;
  auVar8._12_4_ = iStack_1fc - iStack_20c;
  auVar8._8_4_ = iStack_200 - iStack_210;
  auVar20._8_8_ = CONCAT44(iVar3,iVar3);
  auVar20._0_8_ = CONCAT44(iVar3,iVar3);
  auVar20 = pmulld(auVar8,auVar20);
  auVar19._4_4_ = iStack_1e4 - iStack_1f4;
  auVar19._0_4_ = local_1e8 - local_1f8;
  auVar19._12_4_ = iStack_1dc - iStack_1ec;
  auVar19._8_4_ = iStack_1e0 - iStack_1f0;
  auVar18._8_8_ = CONCAT44(iVar2,iVar2);
  auVar18._0_8_ = CONCAT44(iVar2,iVar2);
  auVar18 = pmulld(auVar19,auVar18);
  local_248 = auVar18._0_4_;
  iStack_244 = auVar18._4_4_;
  iStack_240 = auVar18._8_4_;
  iStack_23c = auVar18._12_4_;
  local_258 = auVar20._0_4_;
  iStack_254 = auVar20._4_4_;
  iStack_250 = auVar20._8_4_;
  iStack_24c = auVar20._12_4_;
  auVar18 = ZEXT416(in_EDX);
  *in_RSI = local_408;
  in_RSI[1] = uStack_400;
  in_RSI[2] = local_418;
  in_RSI[3] = uStack_410;
  in_RSI[4] = CONCAT44((iStack_2a4 - iStack_2b4) + iVar16 >> auVar21,
                       (local_2a8 - local_2b8) + iVar16 >> auVar21);
  in_RSI[5] = CONCAT44((iStack_29c - iStack_2ac) + iVar16 >> auVar21,
                       (iStack_2a0 - iStack_2b0) + iVar16 >> auVar21);
  in_RSI[6] = CONCAT44((iStack_244 - iStack_254) + iVar16 >> auVar18,
                       (local_248 - local_258) + iVar16 >> auVar18);
  in_RSI[7] = CONCAT44((iStack_23c - iStack_24c) + iVar16 >> auVar18,
                       (iStack_240 - iStack_250) + iVar16 >> auVar18);
  return;
}

Assistant:

static void fdct4x4_sse4_1(__m128i *in, __m128i *out, int bit,
                           const int num_col) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  __m128i s0, s1, s2, s3;
  __m128i u0, u1, u2, u3;
  __m128i v0, v1, v2, v3;

  int endidx = 3 * num_col;
  s0 = _mm_add_epi32(in[0], in[endidx]);
  s3 = _mm_sub_epi32(in[0], in[endidx]);
  endidx -= num_col;
  s1 = _mm_add_epi32(in[num_col], in[endidx]);
  s2 = _mm_sub_epi32(in[num_col], in[endidx]);

  // btf_32_sse4_1_type0(cospi32, cospi32, s[01], u[02], bit);
  u0 = _mm_mullo_epi32(s0, cospi32);
  u1 = _mm_mullo_epi32(s1, cospi32);
  u2 = _mm_add_epi32(u0, u1);
  v0 = _mm_sub_epi32(u0, u1);

  u3 = _mm_add_epi32(u2, rnding);
  v1 = _mm_add_epi32(v0, rnding);

  u0 = _mm_srai_epi32(u3, bit);
  u2 = _mm_srai_epi32(v1, bit);

  // btf_32_sse4_1_type1(cospi48, cospi16, s[23], u[13], bit);
  v0 = _mm_mullo_epi32(s2, cospi48);
  v1 = _mm_mullo_epi32(s3, cospi16);
  v2 = _mm_add_epi32(v0, v1);

  v3 = _mm_add_epi32(v2, rnding);
  u1 = _mm_srai_epi32(v3, bit);

  v0 = _mm_mullo_epi32(s2, cospi16);
  v1 = _mm_mullo_epi32(s3, cospi48);
  v2 = _mm_sub_epi32(v1, v0);

  v3 = _mm_add_epi32(v2, rnding);
  u3 = _mm_srai_epi32(v3, bit);

  // Note: shift[1] and shift[2] are zeros

  out[0] = u0;
  out[1] = u1;
  out[2] = u2;
  out[3] = u3;
}